

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
push_back<(anonymous_namespace)::ns::Employee_AMN_const&>
          (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this,Employee_AMN *val)

{
  new_allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *this_00;
  long lVar1;
  allocator_type *__a;
  void *pvVar2;
  undefined8 uVar3;
  size_type __n;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  pointer pbVar5;
  json_runtime_error<std::domain_error,_void> *this_01;
  Employee_AMN *in_RDX;
  Employee_AMN *extraout_RDX;
  Employee_AMN *extraout_RDX_00;
  Employee_AMN *__args;
  string local_50;
  
  for (; ((byte)*this & 0xf) == 9;
      this = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> **)(this + 8)) {
  }
  if (((byte)*this & 0xf) == 0xe) {
    lVar1 = *(long *)(this + 8);
    __a = *(allocator_type **)(lVar1 + 0x10);
    if (__a == *(allocator_type **)(lVar1 + 0x18)) {
      this_00 = (new_allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(lVar1 + 8);
      __n = std::
            vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
            ::_M_check_len((vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                            *)this_00,1,"vector::_M_realloc_insert");
      pvVar2 = *(void **)(lVar1 + 8);
      uVar3 = *(undefined8 *)(lVar1 + 0x10);
      if (__n == 0) {
        pbVar4 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0;
        __args = extraout_RDX;
      }
      else {
        pbVar4 = __gnu_cxx::
                 new_allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::allocate(this_00,__n,(void *)0x0);
        __args = extraout_RDX_00;
      }
      std::
      allocator_traits<std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
      ::
      construct<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Employee_AMN_const&>
                ((allocator_type *)(pbVar4 + ((long)__a - (long)pvVar2 >> 4)),
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)val,__args);
      pbVar5 = std::
               vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
               ::_S_do_relocate(pvVar2,__a,pbVar4,this_00);
      pbVar5 = std::
               vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
               ::_S_do_relocate(__a,uVar3,pbVar5 + 1,this_00);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(lVar1 + 0x18) - (long)pvVar2);
      }
      *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)(lVar1 + 8) = pbVar4;
      *(pointer *)(lVar1 + 0x10) = pbVar5;
      *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)(lVar1 + 0x18) =
           pbVar4 + __n;
    }
    else {
      std::
      allocator_traits<std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
      ::
      construct<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Employee_AMN_const&>
                (__a,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)val,in_RDX)
      ;
      *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + 0x10;
    }
    return;
  }
  this_01 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Attempting to insert into a value that is not an array","");
  json_runtime_error<std::domain_error,_void>::json_runtime_error(this_01,&local_50);
  __cxa_throw(this_01,&json_runtime_error<std::domain_error,void>::typeinfo,
              json_runtime_error<std::domain_error,_void>::~json_runtime_error);
}

Assistant:

void push_back(T&& val)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    cast<array_storage>().value().push_back(std::forward<T>(val));
                    break;
                case json_storage_kind::json_reference:
                    cast<json_reference_storage>().value().push_back(std::forward<T>(val));
                    break;
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }